

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O0

HelicsTranslator
helicsFederateRegisterTranslator
          (HelicsFederate fed,HelicsTranslatorTypes type,char *name,HelicsError *err)

{
  string_view endpointType;
  string_view translatorName;
  bool bVar1;
  Translator *pTVar2;
  pointer pTVar3;
  size_t in_RCX;
  char *in_RDX;
  int in_ESI;
  char *in_RDI;
  string_view in_stack_00000000;
  __single_object trans;
  shared_ptr<helics::Federate> fedObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  HelicsFederate in_stack_ffffffffffffff38;
  shared_ptr<helics::Federate> *in_stack_ffffffffffffff78;
  shared_ptr<helics::Federate> *trans_00;
  shared_ptr<helics::Federate> *in_stack_ffffffffffffff80;
  shared_ptr<helics::Federate> *fed_00;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  __sv_type local_68;
  undefined4 local_3c;
  __shared_ptr local_38 [4];
  int32_t in_stack_ffffffffffffffcc;
  Federate *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  HelicsTranslator local_8;
  
  getFedSharedPtr(in_stack_ffffffffffffff38,
                  (HelicsError *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_38);
  if (bVar1) {
    std::make_unique<helics::TranslatorObject>();
    std::__shared_ptr_access<helics::Federate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<helics::Federate,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1eb1dc);
    if (in_RDX == (char *)0x0) {
      local_68 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff20)
      ;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff78);
    translatorName._M_len._4_4_ = in_ESI;
    translatorName._M_len._0_4_ = in_stack_ffffffffffffffe8;
    translatorName._M_str = in_RDI;
    endpointType._M_str = in_RDX;
    endpointType._M_len = in_RCX;
    trans_00 = in_stack_ffffffffffffff78;
    fed_00 = in_stack_ffffffffffffff80;
    pTVar2 = helics::Federate::registerTranslator
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,translatorName,
                        endpointType,in_stack_00000000);
    pTVar3 = std::
             unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
             operator->((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                         *)0x1eb28a);
    pTVar3->transPtr = pTVar2;
    std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
    operator->((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                *)0x1eb29d);
    std::shared_ptr<helics::Federate>::operator=
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    pTVar3 = std::
             unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
             operator->((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                         *)0x1eb2c6);
    pTVar3->custom = in_ESI == 0;
    std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
    unique_ptr((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                *)in_stack_ffffffffffffff80,
               (unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                *)in_stack_ffffffffffffff78);
    local_8 = federateAddTranslator
                        (fed_00,(unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                                 *)trans_00);
    std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
    ~unique_ptr((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                 *)CONCAT44(in_ESI,in_stack_ffffffffffffff30));
    local_3c = 1;
    std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
    ~unique_ptr((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                 *)CONCAT44(in_ESI,in_stack_ffffffffffffff30));
  }
  else {
    local_8 = (HelicsTranslator)0x0;
    local_3c = 1;
  }
  std::shared_ptr<helics::Federate>::~shared_ptr((shared_ptr<helics::Federate> *)0x1eb3fd);
  return local_8;
}

Assistant:

HELICS_EXPORT HelicsTranslator helicsFederateRegisterTranslator(HelicsFederate fed,
                                                                HelicsTranslatorTypes type,
                                                                const char* name,
                                                                HelicsError* err)
{
    // now generate a generic subscription
    auto fedObj = getFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }

    try {
        auto trans = std::make_unique<helics::TranslatorObject>();
        trans->transPtr = &fedObj->registerTranslator(type, AS_STRING_VIEW(name));
        trans->fedptr = std::move(fedObj);
        trans->custom = (type == HELICS_TRANSLATOR_TYPE_CUSTOM);
        return federateAddTranslator(fed, std::move(trans));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}